

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O3

void __thiscall PatternGrid::mousePressEvent(PatternGrid *this,QMouseEvent *evt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPoint QVar4;
  ulong uVar5;
  int iVar6;
  uint row;
  double dVar7;
  double in_XMM1_Qa;
  PatternCursorBase PVar8;
  PatternAnchor cursor;
  PatternSelection selection;
  PatternSelection local_50;
  Iterator local_38;
  
  if (*(int *)(evt + 0x40) == 1) {
    dVar7 = (double)QEventPoint::position();
    iVar6 = (int)((double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7);
    QVar4.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    QVar4.xp = iVar6;
    this->mMousePos = QVar4;
    iVar2 = PatternLayout::patternStart(&this->mLayout);
    if (iVar6 < iVar2) {
      PatternModel::deselect(this->mModel);
      iVar2 = (this->mMousePos).yp;
      iVar6 = PatternModel::cursorRow(this->mModel);
      iVar3 = CellPainter::cellHeight(&(this->mPainter).super_CellPainter);
      iVar2 = (iVar2 / iVar3 + iVar6) - this->mVisibleRows / 2;
      bVar1 = rowIsValid(this,iVar2);
      if (bVar1) {
        this->mMouseOp = selectingRows;
        PatternModel::selectRow(this->mModel,iVar2);
        return;
      }
    }
    else {
      PVar8 = (PatternCursorBase)mouseToCursor(this,this->mMousePos);
      cursor.super_PatternCursorBase.track = PVar8.track;
      row = PVar8.row;
      if (((cursor.super_PatternCursorBase.track < 4 && -1 < (int)row) &&
           (uint)PVar8.column >> 2 < 3) && (bVar1 = rowIsValid(this,row), bVar1)) {
        (this->mSelectionStart).super_PatternCursorBase = PVar8;
        bVar1 = PatternModel::hasSelection(this->mModel);
        if (bVar1) {
          PatternModel::selection(this->mModel);
          if ((uint)PVar8.column < 9) {
            uVar5 = *(ulong *)(&DAT_001b6da0 + (PVar8._0_8_ >> 0x20) * 8);
          }
          else {
            uVar5 = 0x400000000;
          }
          cursor.super_PatternCursorBase._0_8_ = row & 0x7fffffff | uVar5;
          bVar1 = PatternSelection::contains(&local_50,cursor);
          if (bVar1) {
            this->mMouseOp = dragging;
            PatternSelection::iterator(&local_38,&local_50);
            this->mDragRow = row - local_38.mStart.super_PatternCursorBase.row;
            return;
          }
        }
        PatternModel::deselect(this->mModel);
        this->mMouseOp = beginSelecting;
      }
    }
  }
  return;
}

Assistant:

void PatternGrid::mousePressEvent(QMouseEvent *evt) {
    if (evt->button() == Qt::LeftButton) {

        mMousePos = evt->pos();

        if (mMousePos.x() < mLayout.patternStart()) {
            // select whole rows instead of cells
            mModel.deselect();
            int row = mouseToRow(mMousePos.y());
            if (rowIsValid(row)) {
                mMouseOp = MouseOperation::selectingRows;
                mModel.selectRow(row);
            }
        } else {
            // now convert the mouse coordinates to a coordinate on the grid
            auto cursor = mouseToCursor(mMousePos);
            if (cursor.isValid() && rowIsValid(cursor.row)) {
                mSelectionStart = cursor;

                if (mModel.hasSelection()) {
                    // check if the mouse is within the selection rectangle
                    auto selection = mModel.selection();
                    if (selection.contains(cursor)) {
                        mMouseOp = MouseOperation::dragging;
                        mDragRow = cursor.row - selection.iterator().rowStart();
                        return;
                    }
                }

                mModel.deselect();
                mMouseOp = MouseOperation::beginSelecting;

            }
        }

    }
}